

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

PackageMempoolAcceptResult *
ProcessNewPackage(Chainstate *active_chainstate,CTxMemPool *pool,Package *package,bool test_accept,
                 optional<CFeeRate> *client_maxfeerate)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  CChainParams *this;
  PackageMempoolAcceptResult *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  COutPoint *hashTx;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range2;
  CChainParams *chainparams;
  PackageMempoolAcceptResult *result;
  iterator __end2;
  iterator __begin2;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  BlockValidationState state_dummy;
  FlushStateMode in_stack_0000017c;
  BlockValidationState *in_stack_00000180;
  Chainstate *in_stack_00000188;
  int in_stack_00000274;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_fffffffffffffeb0;
  CCoinsViewCache *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac,(AnnotatedMixin<std::recursive_mutex> *)0x7cd339);
  bVar2 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_fffffffffffffeb8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!package.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x760,
                  "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                 );
  }
  cVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffeb0);
  cVar4 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffeb0);
  bVar2 = std::
          all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,ProcessNewPackage(Chainstate&,CTxMemPool&,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,bool,std::optional<CFeeRate>const&)::__0>
                    (cVar3._M_current,cVar4._M_current);
  if (!bVar2) {
    __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x761,
                  "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                 );
  }
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  this = ChainstateManager::GetParams
                   ((ChainstateManager *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  ProcessNewPackage::anon_class_56_7_3890a3a2::operator()((anon_class_56_7_3890a3a2 *)this);
  if (((in_R8B & 1) != 0) ||
     (in_stack_fffffffffffffec7 =
           ValidationState<PackageValidationResult>::IsInvalid
                     ((ValidationState<PackageValidationResult> *)
                      CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
     (bool)in_stack_fffffffffffffec7)) {
    std::vector<COutPoint,_std::allocator<COutPoint>_>::begin(in_stack_fffffffffffffeb0);
    std::vector<COutPoint,_std::allocator<COutPoint>_>::end(in_stack_fffffffffffffeb0);
    while (bVar2 = __gnu_cxx::
                   operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                               *)in_stack_fffffffffffffeb8,
                              (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                               *)in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
      ::operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                   *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffeb8 = Chainstate::CoinsTip((Chainstate *)this);
      CCoinsViewCache::Uncache
                ((CCoinsViewCache *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (COutPoint *)in_stack_fffffffffffffeb8);
      __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
      ::operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
  }
  BlockValidationState::BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  Chainstate::FlushStateToDisk
            (in_stack_00000188,in_stack_00000180,in_stack_0000017c,in_stack_00000274);
  BlockValidationState::~BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

PackageMempoolAcceptResult ProcessNewPackage(Chainstate& active_chainstate, CTxMemPool& pool,
                                                   const Package& package, bool test_accept, const std::optional<CFeeRate>& client_maxfeerate)
{
    AssertLockHeld(cs_main);
    assert(!package.empty());
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));

    std::vector<COutPoint> coins_to_uncache;
    const CChainParams& chainparams = active_chainstate.m_chainman.GetParams();
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(cs_main) {
        AssertLockHeld(cs_main);
        if (test_accept) {
            auto args = MemPoolAccept::ATMPArgs::PackageTestAccept(chainparams, GetTime(), coins_to_uncache);
            return MemPoolAccept(pool, active_chainstate).AcceptMultipleTransactions(package, args);
        } else {
            auto args = MemPoolAccept::ATMPArgs::PackageChildWithParents(chainparams, GetTime(), coins_to_uncache, client_maxfeerate);
            return MemPoolAccept(pool, active_chainstate).AcceptPackage(package, args);
        }
    }